

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_manager.h
# Opt level: O2

bool __thiscall
miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::
waitingCompare(TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>
               *this,int32_t lhs,int32_t rhs)

{
  bool bVar1;
  TimerInfoPtr infor;
  TimerInfoPtr infol;
  undefined1 local_40 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  findTimer((TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent> *)
            (local_40 + 0x10),(int32_t)this);
  findTimer((TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent> *)
            local_40,(int32_t)this);
  if ((pointer)local_40._0_8_ == (pointer)0x0 || (pointer)local_40._16_8_ == (pointer)0x0) {
    bVar1 = (ulong)local_40._16_8_ < (ulong)local_40._0_8_;
  }
  else {
    bVar1 = TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator<
                      ((TimeBase<miniros::SteadyTime,_miniros::WallDuration> *)
                       &(((pointer)(local_40._16_8_ + 0x40))->
                        super___shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount,
                       (SteadyTime *)
                       &(((pointer)(local_40._0_8_ + 0x40))->
                        super___shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return bVar1;
}

Assistant:

bool TimerManager<T, D, E>::waitingCompare(int32_t lhs, int32_t rhs)
{
  TimerInfoPtr infol = findTimer(lhs);
  TimerInfoPtr infor = findTimer(rhs);
  if (!infol || !infor)
  {
    return infol < infor;
  }

  return infol->next_expected < infor->next_expected;
}